

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find(StringPiece *this,StringPiece s,size_type pos)

{
  char *pcVar1;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  char *result;
  long local_40;
  long local_8;
  
  if ((in_RDI[1] < 1) || ((char *)in_RDI[1] < in_RCX)) {
    if (((in_RDI[1] == 0) && (in_RCX == (char *)0x0)) && (in_RDX == (char *)0x0)) {
      local_8 = 0;
    }
    else {
      local_8 = -1;
    }
  }
  else {
    pcVar1 = std::search<char_const*,char_const*>(in_RDX,in_RSI,(char *)in_RDI,in_RCX);
    if (pcVar1 == (char *)(*in_RDI + in_RDI[1])) {
      local_40 = -1;
    }
    else {
      local_40 = (long)pcVar1 - *in_RDI;
    }
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

stringpiece_ssize_type StringPiece::find(StringPiece s, size_type pos) const {
  if (length_ <= 0 || pos > static_cast<size_type>(length_)) {
    if (length_ == 0 && pos == 0 && s.length_ == 0) return 0;
    return npos;
  }
  const char *result = std::search(ptr_ + pos, ptr_ + length_,
                                   s.ptr_, s.ptr_ + s.length_);
  return result == ptr_ + length_ ? npos : result - ptr_;
}